

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classes.cpp
# Opt level: O1

PyObject * PyInit_classes(void)

{
  int iVar1;
  undefined8 uVar2;
  class_<World> *this;
  module m;
  int minor;
  int major;
  class_<World> cStack_48;
  handle local_40;
  int local_38;
  int local_34;
  code *local_30;
  undefined8 local_28;
  code *local_20;
  undefined8 local_18;
  
  uVar2 = Py_GetVersion();
  iVar1 = __isoc99_sscanf(uVar2,"%i.%i",&local_34,&local_38);
  if (iVar1 == 2) {
    if (local_38 == 10 && local_34 == 3) {
      pybind11::module::module((module *)&local_40,"classes","pybind11 class example");
      pybind11::class_<World>::class_<>(&cStack_48,local_40,"World");
      pybind11::class_<World>::
      def<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_shibasisp[P]pybind11_examples_pybind11_include_pybind11_pybind11_h:1295:28)>
                (&cStack_48,"__init__",(type *)&local_30);
      local_30 = World::greet_abi_cxx11_;
      local_28 = 0;
      this = pybind11::class_<World>::def<std::__cxx11::string(World::*)()>
                       (&cStack_48,"greet",(offset_in_World_to_subr *)&local_30);
      local_20 = World::set;
      local_18 = 0;
      pybind11::class_<World>::def<void(World::*)(std::__cxx11::string)>
                (this,"set",(offset_in_World_to_subr *)&local_20);
      pybind11::object::~object((object *)&cStack_48);
      pybind11::object::~object((object *)&local_40);
    }
    else {
      PyErr_Format(_PyExc_ImportError,
                   "Python version mismatch: module was compiled for version %i.%i, while the interpreter is running version %i.%i."
                   ,3,10);
      local_40.m_ptr = (PyObject *)0x0;
    }
  }
  else {
    PyErr_SetString(_PyExc_ImportError,"Can\'t parse Python version.");
    local_40.m_ptr = (PyObject *)0x0;
  }
  return local_40.m_ptr;
}

Assistant:

PYBIND11_PLUGIN(classes)
{
    py::module m("classes","pybind11 class example");

    py::class_<World>(m,"World")
	.def(py::init<>())
        .def("greet", &World::greet)
        .def("set", &World::set);
return m.ptr();
}